

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

void __thiscall vkb::DeviceBuilder::DeviceBuilder(DeviceBuilder *this,PhysicalDevice *phys_device)

{
  PhysicalDevice::PhysicalDevice(&this->physical_device);
  (this->info).flags = 0;
  (this->info).pNext_chain.
  super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->info).pNext_chain.
  super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->info).allocation_callbacks = (VkAllocationCallbacks *)0x0;
  (this->info).pNext_chain.
  super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->info).queue_descriptions.
  super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->info).queue_descriptions.
  super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->info).queue_descriptions.
  super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PhysicalDevice::operator=(&this->physical_device,phys_device);
  return;
}

Assistant:

DeviceBuilder::DeviceBuilder(PhysicalDevice phys_device) { physical_device = std::move(phys_device); }